

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecWec.h
# Opt level: O2

void Vec_WecGrow(Vec_Wec_t *p,int nCapMin)

{
  Vec_Int_t *pVVar1;
  int iVar2;
  
  iVar2 = p->nCap;
  if (iVar2 < nCapMin) {
    if (p->pArray == (Vec_Int_t *)0x0) {
      pVVar1 = (Vec_Int_t *)malloc((long)nCapMin << 4);
    }
    else {
      pVVar1 = (Vec_Int_t *)realloc(p->pArray,(long)nCapMin << 4);
      iVar2 = p->nCap;
    }
    p->pArray = pVVar1;
    memset(pVVar1 + iVar2,0,(long)(nCapMin - iVar2) << 4);
    p->nCap = nCapMin;
  }
  return;
}

Assistant:

static inline void Vec_WecGrow( Vec_Wec_t * p, int nCapMin )
{
    if ( p->nCap >= nCapMin )
        return;
    p->pArray = ABC_REALLOC( Vec_Int_t, p->pArray, nCapMin ); 
    memset( p->pArray + p->nCap, 0, sizeof(Vec_Int_t) * (nCapMin - p->nCap) );
    p->nCap   = nCapMin;
}